

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall
TPZSkylMatrix<std::complex<float>_>::AutoFill
          (TPZSkylMatrix<std::complex<float>_> *this,int64_t nrow,int64_t ncol,int symmetric)

{
  double dVar1;
  long lVar2;
  int iVar3;
  long *plVar4;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  TPZMatrix<std::complex<float>_> *in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  complex<float> val_1;
  int64_t j_1;
  complex<float> sum_1;
  int64_t i_2;
  complex<float> val;
  int64_t j;
  complex<float> sum;
  int64_t i_1;
  int64_t i;
  TPZVec<long> skyline;
  size_t in_stack_00000298;
  char *in_stack_000002a0;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  TPZVec<std::complex<float>_> *in_stack_fffffffffffffec8;
  TPZVec<std::complex<float>_*> *in_stack_fffffffffffffed0;
  long lVar5;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  complex<float> local_e0;
  undefined1 local_d8 [24];
  complex<float> local_c0;
  long local_b8;
  complex<float> local_b0;
  long local_a8;
  complex<float> local_a0;
  undefined1 local_98 [24];
  complex<float> local_80;
  long local_78;
  complex<float> local_70;
  long local_68;
  long local_60;
  undefined8 local_58;
  TPZVec<long> local_40;
  long local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if ((in_RSI != in_RDX) || (in_ECX == 0)) {
    pzinternal::DebugStopImpl(in_stack_000002a0,in_stack_00000298);
  }
  TPZMatrix<std::complex<float>_>::Redim(in_RDI,local_10,local_18);
  TPZVec<long>::TPZVec
            ((TPZVec<long> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  TPZVec<std::complex<float>_*>::resize
            ((TPZVec<std::complex<float>_*> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  local_58 = 0;
  TPZVec<std::complex<float>_*>::Fill
            (in_stack_fffffffffffffed0,(complex<float> **)in_stack_fffffffffffffec8,
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  for (local_60 = 0; lVar2 = local_60, local_60 < local_10; local_60 = local_60 + 1) {
    iVar3 = rand();
    plVar4 = TPZVec<long>::operator[](&local_40,local_60);
    *plVar4 = (lVar2 * iVar3) / 0x7fffffff;
  }
  InitializeElem((TPZVec<long> *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 (TPZVec<std::complex<float>_*> *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  for (local_68 = 0; local_68 < local_10; local_68 = local_68 + 1) {
    std::complex<float>::complex(&local_70,0.0,0.0);
    plVar4 = TPZVec<long>::operator[](&local_40,local_68);
    for (local_78 = *plVar4; lVar2 = local_68, local_78 < local_68; local_78 = local_78 + 1) {
      TPZMatrix<std::complex<float>_>::GetRandomVal
                ((TPZMatrix<std::complex<float>_> *)
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      in_stack_fffffffffffffee8 = extraout_XMM0_Da;
      in_stack_fffffffffffffeec = extraout_XMM0_Db;
      local_80._M_value._0_4_ = extraout_XMM0_Da;
      local_80._M_value._4_4_ = extraout_XMM0_Db;
      if (local_78 == local_68) {
        dVar1 = fabs((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        std::complex<float>::operator=(&local_80,SUB84(dVar1,0));
      }
      (*(in_RDI->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                (in_RDI,local_78,local_68,&local_80);
      dVar1 = fabs((double)CONCAT44(local_80._M_value._4_4_,(undefined4)local_80._M_value));
      std::complex<float>::operator+=(&local_70,SUB84(dVar1,0));
    }
    lVar5 = local_68;
    std::complex<float>::complex(&local_a0,1.0,0.0);
    std::operator+((complex<float> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                   (complex<float> *)0x137081e);
    (*(in_RDI->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
              (in_RDI,lVar2,lVar5,local_98);
  }
  for (local_a8 = 0; local_a8 < local_10; local_a8 = local_a8 + 1) {
    std::complex<float>::complex(&local_b0,0.0,0.0);
    for (local_b8 = 0; lVar2 = local_a8, local_b8 < local_10; local_b8 = local_b8 + 1) {
      std::complex<float>::complex(&local_c0,0.0,0.0);
      (*(in_RDI->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (in_RDI,local_b8,local_a8);
      dVar1 = fabs((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      std::complex<float>::operator+=(&local_b0,SUB84(dVar1,0));
    }
    std::complex<float>::complex(&local_e0,1.0,0.0);
    std::operator+((complex<float> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                   (complex<float> *)0x13709c4);
    in_stack_fffffffffffffe78 = extraout_XMM0_Da_01;
    in_stack_fffffffffffffe7c = extraout_XMM0_Db_01;
    in_stack_fffffffffffffe80 = extraout_XMM0_Dc;
    in_stack_fffffffffffffe84 = extraout_XMM0_Dd;
    (*(in_RDI->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
              (in_RDI,lVar2,lVar2,local_d8);
  }
  TPZVec<long>::~TPZVec
            ((TPZVec<long> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::AutoFill(int64_t nrow, int64_t ncol, int symmetric) {
    if (nrow != ncol || !symmetric)
    {
        DebugStop();
    }
    TPZMatrix<TVar>::Redim(nrow,ncol);
    TPZVec<int64_t> skyline(nrow);
    fElem.resize(nrow+1);
    fElem.Fill(0);
    for (int64_t i=0; i<nrow; i++) {
        skyline[i]=(i*(rand()))/RAND_MAX;
    }
//    std::cout << "skyline " << skyline << std::endl;
    InitializeElem(skyline,fStorage,fElem);
    
    for (int64_t i=0; i<nrow; i++) {
        TVar sum = 0.;
        for (int64_t j=skyline[i]; j<i; j++) {
            TVar val = this->GetRandomVal();
            if constexpr (is_complex<TVar>::value){
                if(j==i) val = fabs(val);
            }
            PutVal(j,i,val);
            sum += fabs(val);
        }
        PutVal(i,i,sum+(TVar)1.);
    }
    for (int64_t i=0; i<nrow; i++) {
        TVar sum = (TVar)0.;
        for (int64_t j=0; j<nrow; j++) {
            TVar val;
            val = GetVal(j,i);
            sum += fabs(val);
        }
        PutVal(i,i,sum+(TVar)1.);
    }

}